

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer_declaration.h
# Opt level: O0

void __thiscall ncnn::Einsum_final::~Einsum_final(Einsum_final *this)

{
  Einsum_final *in_stack_00000010;
  
  ~Einsum_final(in_stack_00000010);
  return;
}

Assistant:

virtual int create_pipeline(const Option& opt) {
        { int ret = Einsum::create_pipeline(opt); if (ret) return ret; }
        return 0;
    }